

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O1

void __thiscall Assimp::PretransformVertices::Execute(PretransformVertices *this,aiScene *pScene)

{
  char *pcVar1;
  size_t *psVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  aiMesh *paVar7;
  aiBone *paVar8;
  _List_node_base *p_Var9;
  aiAnimation *this_00;
  aiCamera *paVar10;
  aiLight *paVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  aiScene *paVar16;
  pointer __src;
  bool bVar17;
  Logger *pLVar18;
  aiMesh **__dest;
  uint auVar19 [2];
  ulong *puVar20;
  ulong uVar21;
  aiVector3D *paVar22;
  aiColor4D *__s;
  aiNode *paVar23;
  aiNode *paVar24;
  aiNode **ppaVar25;
  uint *puVar26;
  runtime_error *this_01;
  aiFace *paVar27;
  ulong uVar28;
  _List_node_base *p_Var29;
  uint uVar30;
  PretransformVertices *pPVar31;
  PretransformVertices *pPVar32;
  ulong uVar33;
  long lVar34;
  uint uVar35;
  ulong uVar36;
  size_t __n;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  uint local_23c;
  aiScene *local_238;
  aiMesh **local_230;
  PretransformVertices *local_228;
  uint iVertices;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> apcOutMeshes;
  list<unsigned_int,_std::allocator<unsigned_int>_> aiVFormats;
  vector<unsigned_int,_std::allocator<unsigned_int>_> s;
  uint aiTemp [2];
  undefined1 local_198 [96];
  ios_base local_138 [264];
  
  pLVar18 = DefaultLogger::get();
  Logger::debug(pLVar18,"PretransformVerticesProcess begin");
  if (pScene->mNumMeshes != 0) {
    paVar23 = pScene->mRootNode;
    CountNodes(this,paVar23);
    if (this->configTransform == true) {
      fVar12 = (this->configTransformation).a1;
      fVar13 = (this->configTransformation).a2;
      fVar14 = (this->configTransformation).a3;
      fVar15 = (this->configTransformation).a4;
      fVar3 = (this->configTransformation).b1;
      fVar4 = (this->configTransformation).b2;
      fVar5 = (this->configTransformation).b3;
      fVar6 = (this->configTransformation).b4;
      fVar43 = (this->configTransformation).c1;
      fVar37 = (this->configTransformation).c2;
      fVar38 = (this->configTransformation).c3;
      fVar40 = (this->configTransformation).c4;
      fVar39 = (this->configTransformation).d2;
      fVar41 = (this->configTransformation).d3;
      fVar42 = (this->configTransformation).d4;
      (paVar23->mTransformation).d1 = (this->configTransformation).d1;
      (paVar23->mTransformation).d2 = fVar39;
      (paVar23->mTransformation).d3 = fVar41;
      (paVar23->mTransformation).d4 = fVar42;
      (paVar23->mTransformation).c1 = fVar43;
      (paVar23->mTransformation).c2 = fVar37;
      (paVar23->mTransformation).c3 = fVar38;
      (paVar23->mTransformation).c4 = fVar40;
      (paVar23->mTransformation).b1 = fVar3;
      (paVar23->mTransformation).b2 = fVar4;
      (paVar23->mTransformation).b3 = fVar5;
      (paVar23->mTransformation).b4 = fVar6;
      (paVar23->mTransformation).a1 = fVar12;
      (paVar23->mTransformation).a2 = fVar13;
      (paVar23->mTransformation).a3 = fVar14;
      (paVar23->mTransformation).a4 = fVar15;
    }
    local_228 = this;
    ComputeAbsoluteTransform(this,pScene->mRootNode);
    uVar30 = pScene->mNumMeshes;
    if (uVar30 != 0) {
      uVar36 = 0;
      do {
        paVar7 = pScene->mMeshes[uVar36];
        if (paVar7->mNumBones != 0) {
          uVar33 = 0;
          do {
            paVar8 = paVar7->mBones[uVar33];
            if (paVar8 != (aiBone *)0x0) {
              if (paVar8->mWeights != (aiVertexWeight *)0x0) {
                operator_delete__(paVar8->mWeights);
              }
              operator_delete(paVar8);
            }
            uVar33 = uVar33 + 1;
          } while (uVar33 < paVar7->mNumBones);
        }
        if (paVar7->mBones != (aiBone **)0x0) {
          operator_delete__(paVar7->mBones);
        }
        paVar7->mBones = (aiBone **)0x0;
        uVar36 = uVar36 + 1;
        uVar30 = pScene->mNumMeshes;
      } while (uVar36 < uVar30);
    }
    apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_238 = pScene;
    if (local_228->configKeepHierarchy == false) {
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve
                (&apcOutMeshes,(ulong)(pScene->mNumMaterials * 2));
      aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
      super__List_node_base._M_next = (_List_node_base *)&aiVFormats;
      aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
      _M_size = 0;
      aiTemp = (uint  [2])((ulong)aiTemp & 0xffffffff00000000);
      aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
      super__List_node_base._M_prev =
           aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
           super__List_node_base._M_next;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&s,(ulong)pScene->mNumMeshes,aiTemp,(allocator_type *)&iVertices);
      BuildMeshRefCountArray
                (local_228,pScene->mRootNode,
                 s.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if (pScene->mNumMaterials != 0) {
        local_230 = (aiMesh **)((ulong)local_230 & 0xffffffff00000000);
        do {
          pPVar31 = (PretransformVertices *)
                    aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    ._M_node.super__List_node_base._M_next;
          while (pPVar31 != (PretransformVertices *)&aiVFormats) {
            pPVar32 = (PretransformVertices *)(pPVar31->super_BaseProcess)._vptr_BaseProcess;
            operator_delete(pPVar31);
            pPVar31 = pPVar32;
          }
          aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
          _M_size = 0;
          aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
          super__List_node_base._M_next = (_List_node_base *)&aiVFormats;
          aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
          super__List_node_base._M_prev = (_List_node_base *)&aiVFormats;
          GetVFormatList(pPVar31,pScene,(uint)local_230,&aiVFormats);
          std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::sort(&aiVFormats);
          std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::unique(&aiVFormats);
          p_Var29 = aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    ._M_node.super__List_node_base._M_next;
          if ((PretransformVertices *)
              aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              _M_node.super__List_node_base._M_next != (PretransformVertices *)&aiVFormats) {
            do {
              iVertices = 0;
              local_23c = 0;
              CountVerticesAndFaces
                        (local_228,local_238,local_238->mRootNode,(uint)local_230,
                         *(uint *)&p_Var29[1]._M_next,&local_23c,&iVertices);
              uVar35 = iVertices;
              uVar30 = local_23c;
              uVar36 = (ulong)local_23c;
              if (iVertices != 0 && uVar36 != 0) {
                auVar19 = (uint  [2])operator_new(0x520);
                *(undefined8 *)auVar19 = 0;
                *(uint *)((long)auVar19 + 8) = 0;
                memset((aiVector3D **)((long)auVar19 + 0x10),0,0xcc);
                *(aiBone ***)((long)auVar19 + 0xe0) = (aiBone **)0x0;
                *(undefined8 *)((long)auVar19 + 0xe8) = 0;
                *(char *)((long)auVar19 + 0xf0) = '\0';
                memset((char *)((long)auVar19 + 0xf1),0x1b,0x3ff);
                *(uint *)((long)auVar19 + 0x4f0) = 0;
                *(aiAnimMesh ***)((long)auVar19 + 0x4f8) = (aiAnimMesh **)0x0;
                *(undefined8 *)((long)auVar19 + 0x500) = 0;
                *(undefined8 *)((long)auVar19 + 0x508) = 0;
                ((aiVector3D *)((long)auVar19 + 0x510))->x = 0.0;
                ((aiVector3D *)((long)auVar19 + 0x510))->y = 0.0;
                *(float *)((long)auVar19 + 0x518) = 0.0;
                *(aiVector3D **)((long)auVar19 + 0x70) = (aiVector3D *)0x0;
                *(aiVector3D **)((long)auVar19 + 0x78) = (aiVector3D *)0x0;
                *(aiVector3D **)((long)auVar19 + 0x80) = (aiVector3D *)0x0;
                *(aiVector3D **)((long)auVar19 + 0x88) = (aiVector3D *)0x0;
                *(aiVector3D **)((long)auVar19 + 0x90) = (aiVector3D *)0x0;
                *(aiVector3D **)((long)auVar19 + 0x98) = (aiVector3D *)0x0;
                *(aiVector3D **)((long)auVar19 + 0xa0) = (aiVector3D *)0x0;
                *(aiVector3D **)((long)auVar19 + 0xa8) = (aiVector3D *)0x0;
                ((uint *)((long)auVar19 + 0xb0))[0] = 0;
                ((uint *)((long)auVar19 + 0xb0))[1] = 0;
                ((uint *)((long)auVar19 + 0xb8))[0] = 0;
                ((uint *)((long)auVar19 + 0xb8))[1] = 0;
                ((uint *)((long)auVar19 + 0xc0))[0] = 0;
                ((uint *)((long)auVar19 + 0xc0))[1] = 0;
                ((uint *)((long)auVar19 + 200))[0] = 0;
                ((uint *)((long)auVar19 + 200))[1] = 0;
                *(aiColor4D **)((long)auVar19 + 0x30) = (aiColor4D *)0x0;
                *(aiColor4D **)((long)auVar19 + 0x38) = (aiColor4D *)0x0;
                *(aiColor4D **)((long)auVar19 + 0x40) = (aiColor4D *)0x0;
                *(aiColor4D **)((long)auVar19 + 0x48) = (aiColor4D *)0x0;
                *(aiColor4D **)((long)auVar19 + 0x50) = (aiColor4D *)0x0;
                *(aiColor4D **)((long)auVar19 + 0x58) = (aiColor4D *)0x0;
                *(aiColor4D **)((long)auVar19 + 0x60) = (aiColor4D *)0x0;
                *(aiColor4D **)((long)auVar19 + 0x68) = (aiColor4D *)0x0;
                aiTemp = auVar19;
                if (apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*>
                            ((vector<aiMesh*,std::allocator<aiMesh*>> *)&apcOutMeshes,
                             (iterator)
                             apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish,(aiMesh **)aiTemp);
                }
                else {
                  *apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_finish = (aiMesh *)auVar19;
                  apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                paVar7 = apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish[-1];
                paVar7->mNumFaces = uVar30;
                paVar7->mNumVertices = uVar35;
                puVar20 = (ulong *)operator_new__(uVar36 * 0x10 + 8);
                *puVar20 = uVar36;
                paVar27 = (aiFace *)(puVar20 + 1);
                do {
                  paVar27->mNumIndices = 0;
                  paVar27->mIndices = (uint *)0x0;
                  paVar27 = paVar27 + 1;
                } while (paVar27 != (aiFace *)(puVar20 + uVar36 * 2 + 1));
                paVar7->mFaces = (aiFace *)(puVar20 + 1);
                uVar21 = (ulong)uVar35;
                uVar33 = uVar21 * 0xc;
                paVar22 = (aiVector3D *)operator_new__(uVar33);
                uVar36 = uVar21 * 0xc - 0xc;
                memset(paVar22,0,(uVar36 / 0xc) * 0xc + 0xc);
                paVar7->mVertices = paVar22;
                paVar7->mMaterialIndex = (uint)local_230;
                if (((ulong)p_Var29[1]._M_next & 2) != 0) {
                  paVar22 = (aiVector3D *)operator_new__(uVar33);
                  memset(paVar22,0,(uVar36 / 0xc) * 0xc + 0xc);
                  paVar7->mNormals = paVar22;
                }
                if (((ulong)p_Var29[1]._M_next & 4) != 0) {
                  paVar22 = (aiVector3D *)operator_new__(uVar33);
                  memset(paVar22,0,(uVar36 / 0xc) * 0xc + 0xc);
                  paVar7->mTangents = paVar22;
                  paVar22 = (aiVector3D *)operator_new__(uVar33);
                  memset(paVar22,0,(uVar36 / 0xc) * 0xc + 0xc);
                  paVar7->mBitangents = paVar22;
                }
                if (((ulong)p_Var29[1]._M_next & 0x100) != 0) {
                  uVar28 = 0;
                  do {
                    paVar22 = (aiVector3D *)operator_new__(uVar33);
                    memset(paVar22,0,(uVar36 / 0xc) * 0xc + 0xc);
                    paVar7->mTextureCoords[uVar28] = paVar22;
                    paVar7->mNumUVComponents[uVar28] =
                         (((*(uint *)&p_Var29[1]._M_next >> ((byte)uVar28 & 0x1f)) >> 0x10 & 1) != 0
                         ) + 2;
                    uVar30 = (int)uVar28 + 1;
                    uVar28 = (ulong)uVar30;
                  } while (((*(uint *)&p_Var29[1]._M_next >> ((byte)uVar30 & 0x1f)) >> 8 & 1) != 0);
                }
                local_23c = 0;
                uVar30 = *(uint *)&p_Var29[1]._M_next;
                uVar35 = 0;
                if ((uVar30 >> 0x18 & 1) != 0) {
                  uVar36 = 0;
                  do {
                    __s = (aiColor4D *)operator_new__(uVar21 << 4);
                    memset(__s,0,uVar21 << 4);
                    uVar35 = (int)uVar36 + 1;
                    paVar7->mColors[uVar36] = __s;
                    uVar30 = *(uint *)&p_Var29[1]._M_next;
                    uVar36 = (ulong)uVar35;
                  } while (((uVar30 >> ((byte)uVar35 & 0x1f)) >> 0x18 & 1) != 0);
                }
                local_23c = uVar35;
                aiTemp[0] = 0;
                aiTemp[1] = 0;
                CollectData(local_228,local_238,local_238->mRootNode,(uint)local_230,uVar30,paVar7,
                            aiTemp,s.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
              }
              p_Var29 = (((_List_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &p_Var29->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
            } while (p_Var29 != (_List_node_base *)&aiVFormats);
          }
          uVar30 = (uint)local_230 + 1;
          local_230 = (aiMesh **)CONCAT44(local_230._4_4_,uVar30);
          pScene = local_238;
        } while (uVar30 < local_238->mNumMaterials);
      }
      if (apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        aiTemp = (uint  [2])local_198;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)aiTemp,
                   "No output meshes: all meshes are orphaned and are not referenced by any nodes",
                   "");
        std::runtime_error::runtime_error(this_01,(string *)aiTemp);
        *(undefined ***)this_01 = &PTR__runtime_error_002588d0;
        __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      if (pScene->mNumMeshes != 0) {
        uVar36 = 0;
        do {
          paVar7 = pScene->mMeshes[uVar36];
          paVar7->mNumBones = 0;
          paVar7->mBones = (aiBone **)0x0;
          if (paVar7->mNumFaces != 0) {
            lVar34 = 0;
            uVar33 = 0;
            do {
              *(undefined4 *)((long)&paVar7->mFaces->mNumIndices + lVar34) = 0;
              *(undefined8 *)((long)&paVar7->mFaces->mIndices + lVar34) = 0;
              uVar33 = uVar33 + 1;
              lVar34 = lVar34 + 0x10;
            } while (uVar33 < paVar7->mNumFaces);
          }
          if (paVar7 != (aiMesh *)0x0) {
            aiMesh::~aiMesh(paVar7);
            operator_delete(paVar7);
          }
          uVar36 = uVar36 + 1;
        } while (uVar36 < pScene->mNumMeshes);
      }
      uVar30 = (uint)((ulong)((long)apcOutMeshes.
                                    super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)apcOutMeshes.
                                   super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 3);
      pScene->mNumMeshes = uVar30;
      if (uVar30 != 0) {
        uVar36 = 0;
        do {
          pScene->mMeshes[uVar36] =
               apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar36];
          uVar36 = uVar36 + 1;
        } while (uVar36 < pScene->mNumMeshes);
      }
      if (s.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(s.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      p_Var29 = aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                _M_node.super__List_node_base._M_next;
      while (p_Var29 != (_List_node_base *)&aiVFormats) {
        p_Var9 = (((_List_base<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var29->_M_next)->
                 _M_impl)._M_node.super__List_node_base._M_next;
        operator_delete(p_Var29);
        p_Var29 = p_Var9;
      }
    }
    else {
      pPVar31 = local_228;
      BuildWCSMeshes(local_228,&apcOutMeshes,pScene->mMeshes,uVar30,pScene->mRootNode);
      __src = apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_start;
      __n = (long)apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      if (__n != 0) {
        lVar34 = (long)apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
        uVar30 = pScene->mNumMeshes;
        uVar33 = (ulong)uVar30;
        uVar36 = lVar34 + uVar33;
        __dest = (aiMesh **)operator_new__(-(ulong)(uVar36 >> 0x3d != 0) | uVar36 * 8);
        pPVar32 = (PretransformVertices *)pScene->mMeshes;
        memcpy(__dest,pPVar32,uVar33 * 8);
        pPVar31 = (PretransformVertices *)(__dest + uVar33);
        local_230 = __dest;
        memcpy(pPVar31,__src,__n);
        pScene = local_238;
        local_238->mNumMeshes = (int)lVar34 + uVar30;
        if (pPVar32 != (PretransformVertices *)0x0) {
          operator_delete__(pPVar32);
          pPVar31 = pPVar32;
        }
        pScene->mMeshes = local_230;
      }
      if (pScene->mNumMeshes != 0) {
        uVar36 = 0;
        do {
          ApplyTransform(pPVar31,pScene->mMeshes[uVar36],
                         (aiMatrix4x4 *)pScene->mMeshes[uVar36]->mBones);
          pScene->mMeshes[uVar36]->mBones = (aiBone **)0x0;
          pScene->mMeshes[uVar36]->mNumBones = 0;
          uVar36 = uVar36 + 1;
        } while (uVar36 < pScene->mNumMeshes);
      }
    }
    if (pScene->mNumAnimations != 0) {
      uVar36 = 0;
      do {
        this_00 = pScene->mAnimations[uVar36];
        if (this_00 != (aiAnimation *)0x0) {
          aiAnimation::~aiAnimation(this_00);
          operator_delete(this_00);
        }
        uVar36 = uVar36 + 1;
      } while (uVar36 < pScene->mNumAnimations);
    }
    if (pScene->mAnimations != (aiAnimation **)0x0) {
      operator_delete__(pScene->mAnimations);
    }
    pScene->mAnimations = (aiAnimation **)0x0;
    pScene->mNumAnimations = 0;
    if (pScene->mNumCameras != 0) {
      uVar36 = 0;
      do {
        paVar10 = pScene->mCameras[uVar36];
        paVar23 = aiNode::FindNode(pScene->mRootNode,(paVar10->mName).data);
        if (paVar23 == (aiNode *)0x0) {
          __assert_fail("__null != nd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/PretransformVertices.cpp"
                        ,0x265,"virtual void Assimp::PretransformVertices::Execute(aiScene *)");
        }
        fVar39 = (paVar10->mPosition).x;
        fVar41 = (paVar10->mPosition).y;
        fVar42 = (paVar10->mPosition).z;
        fVar43 = (paVar23->mTransformation).b2;
        fVar37 = (paVar23->mTransformation).b1;
        fVar38 = (paVar23->mTransformation).b3;
        fVar40 = (paVar23->mTransformation).b4;
        fVar3 = (paVar23->mTransformation).c2;
        fVar4 = (paVar23->mTransformation).c1;
        fVar5 = (paVar23->mTransformation).c3;
        fVar6 = (paVar23->mTransformation).c4;
        (paVar10->mPosition).x =
             (paVar23->mTransformation).a3 * fVar42 +
             (paVar23->mTransformation).a1 * fVar39 + (paVar23->mTransformation).a2 * fVar41 +
             (paVar23->mTransformation).a4;
        (paVar10->mPosition).y = fVar38 * fVar42 + fVar37 * fVar39 + fVar43 * fVar41 + fVar40;
        (paVar10->mPosition).z = fVar42 * fVar5 + fVar39 * fVar4 + fVar41 * fVar3 + fVar6;
        fVar39 = (paVar10->mLookAt).x;
        fVar41 = (paVar10->mLookAt).y;
        fVar42 = (paVar10->mLookAt).z;
        fVar43 = (paVar23->mTransformation).b2;
        fVar37 = (paVar23->mTransformation).b1;
        fVar38 = (paVar23->mTransformation).b3;
        fVar40 = (paVar23->mTransformation).c2;
        fVar3 = (paVar23->mTransformation).c1;
        fVar4 = (paVar23->mTransformation).c3;
        (paVar10->mLookAt).x =
             (paVar23->mTransformation).a3 * fVar42 +
             (paVar23->mTransformation).a1 * fVar39 + (paVar23->mTransformation).a2 * fVar41;
        (paVar10->mLookAt).y = fVar38 * fVar42 + fVar37 * fVar39 + fVar43 * fVar41;
        (paVar10->mLookAt).z = fVar42 * fVar4 + fVar39 * fVar3 + fVar41 * fVar40;
        fVar39 = (paVar10->mUp).x;
        fVar41 = (paVar10->mUp).y;
        fVar42 = (paVar10->mUp).z;
        fVar43 = (paVar23->mTransformation).b2;
        fVar37 = (paVar23->mTransformation).b1;
        fVar38 = (paVar23->mTransformation).b3;
        fVar40 = (paVar23->mTransformation).c2;
        fVar3 = (paVar23->mTransformation).c1;
        fVar4 = (paVar23->mTransformation).c3;
        (paVar10->mUp).x =
             (paVar23->mTransformation).a3 * fVar42 +
             (paVar23->mTransformation).a1 * fVar39 + (paVar23->mTransformation).a2 * fVar41;
        (paVar10->mUp).y = fVar38 * fVar42 + fVar37 * fVar39 + fVar43 * fVar41;
        (paVar10->mUp).z = fVar42 * fVar4 + fVar39 * fVar3 + fVar41 * fVar40;
        uVar36 = uVar36 + 1;
      } while (uVar36 < pScene->mNumCameras);
    }
    if (pScene->mNumLights != 0) {
      uVar36 = 0;
      do {
        paVar11 = pScene->mLights[uVar36];
        paVar23 = aiNode::FindNode(pScene->mRootNode,(paVar11->mName).data);
        if (paVar23 == (aiNode *)0x0) {
          __assert_fail("__null != nd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/PretransformVertices.cpp"
                        ,0x272,"virtual void Assimp::PretransformVertices::Execute(aiScene *)");
        }
        fVar39 = (paVar11->mPosition).x;
        fVar41 = (paVar11->mPosition).y;
        fVar42 = (paVar11->mPosition).z;
        fVar43 = (paVar23->mTransformation).b2;
        fVar37 = (paVar23->mTransformation).b1;
        fVar38 = (paVar23->mTransformation).b3;
        fVar40 = (paVar23->mTransformation).b4;
        fVar3 = (paVar23->mTransformation).c2;
        fVar4 = (paVar23->mTransformation).c1;
        fVar5 = (paVar23->mTransformation).c3;
        fVar6 = (paVar23->mTransformation).c4;
        (paVar11->mPosition).x =
             (paVar23->mTransformation).a3 * fVar42 +
             (paVar23->mTransformation).a1 * fVar39 + (paVar23->mTransformation).a2 * fVar41 +
             (paVar23->mTransformation).a4;
        (paVar11->mPosition).y = fVar38 * fVar42 + fVar37 * fVar39 + fVar43 * fVar41 + fVar40;
        (paVar11->mPosition).z = fVar42 * fVar5 + fVar39 * fVar4 + fVar41 * fVar3 + fVar6;
        fVar39 = (paVar11->mDirection).x;
        fVar41 = (paVar11->mDirection).y;
        fVar42 = (paVar11->mDirection).z;
        fVar43 = (paVar23->mTransformation).b2;
        fVar37 = (paVar23->mTransformation).b1;
        fVar38 = (paVar23->mTransformation).b3;
        fVar40 = (paVar23->mTransformation).c2;
        fVar3 = (paVar23->mTransformation).c1;
        fVar4 = (paVar23->mTransformation).c3;
        (paVar11->mDirection).x =
             (paVar23->mTransformation).a3 * fVar42 +
             (paVar23->mTransformation).a1 * fVar39 + (paVar23->mTransformation).a2 * fVar41;
        (paVar11->mDirection).y = fVar38 * fVar42 + fVar37 * fVar39 + fVar43 * fVar41;
        (paVar11->mDirection).z = fVar42 * fVar4 + fVar39 * fVar3 + fVar41 * fVar40;
        fVar39 = (paVar11->mUp).x;
        fVar41 = (paVar11->mUp).y;
        fVar42 = (paVar11->mUp).z;
        fVar43 = (paVar23->mTransformation).b2;
        fVar37 = (paVar23->mTransformation).b1;
        fVar38 = (paVar23->mTransformation).b3;
        fVar40 = (paVar23->mTransformation).c2;
        fVar3 = (paVar23->mTransformation).c1;
        fVar4 = (paVar23->mTransformation).c3;
        (paVar11->mUp).x =
             (paVar23->mTransformation).a3 * fVar42 +
             (paVar23->mTransformation).a1 * fVar39 + (paVar23->mTransformation).a2 * fVar41;
        (paVar11->mUp).y = fVar38 * fVar42 + fVar37 * fVar39 + fVar43 * fVar41;
        (paVar11->mUp).z = fVar42 * fVar4 + fVar39 * fVar3 + fVar41 * fVar40;
        uVar36 = uVar36 + 1;
      } while (uVar36 < pScene->mNumLights);
    }
    if (local_228->configKeepHierarchy == false) {
      paVar24 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar24);
      paVar23 = pScene->mRootNode;
      if (paVar24 != paVar23) {
        uVar30 = (paVar23->mName).length;
        (paVar24->mName).length = uVar30;
        memcpy((paVar24->mName).data,(paVar23->mName).data,(ulong)uVar30);
        (paVar24->mName).data[uVar30] = '\0';
      }
      if (paVar23 != (aiNode *)0x0) {
        aiNode::~aiNode(paVar23);
        operator_delete(paVar23);
      }
      pScene->mRootNode = paVar24;
      if (((pScene->mNumMeshes == 1) && (pScene->mNumLights == 0)) && (pScene->mNumCameras == 0)) {
        paVar24->mNumMeshes = 1;
        puVar26 = (uint *)operator_new__(4);
        paVar24->mMeshes = puVar26;
        *puVar26 = 0;
      }
      else {
        uVar30 = pScene->mNumMeshes + pScene->mNumLights + pScene->mNumCameras;
        paVar24->mNumChildren = uVar30;
        ppaVar25 = (aiNode **)operator_new__((ulong)uVar30 << 3);
        paVar24->mChildren = ppaVar25;
        if (pScene->mNumMeshes != 0) {
          lVar34 = 0;
          uVar36 = 0;
          do {
            paVar23 = (aiNode *)operator_new(0x478);
            aiNode::aiNode(paVar23);
            ppaVar25[uVar36] = paVar23;
            paVar23->mParent = pScene->mRootNode;
            paVar7 = pScene->mMeshes[uVar36];
            if (paVar23 != (aiNode *)&paVar7->mName) {
              uVar30 = (paVar7->mName).length;
              (paVar23->mName).length = uVar30;
              memcpy((paVar23->mName).data,(paVar7->mName).data,(ulong)uVar30);
              (paVar23->mName).data[uVar30] = '\0';
            }
            paVar23->mNumMeshes = 1;
            puVar26 = (uint *)operator_new__(4);
            paVar23->mMeshes = puVar26;
            *puVar26 = (uint)uVar36;
            uVar36 = uVar36 + 1;
            lVar34 = lVar34 + 8;
          } while (uVar36 < pScene->mNumMeshes);
          ppaVar25 = (aiNode **)((long)ppaVar25 + lVar34);
        }
        if (pScene->mNumLights != 0) {
          lVar34 = 0;
          uVar36 = 0;
          do {
            paVar24 = (aiNode *)operator_new(0x478);
            aiNode::aiNode(paVar24);
            paVar16 = local_238;
            ppaVar25[uVar36] = paVar24;
            paVar24->mParent = local_238->mRootNode;
            pcVar1 = (paVar24->mName).data;
            uVar30 = snprintf(pcVar1,0x400,"light_%u",uVar36 & 0xffffffff);
            (paVar24->mName).length = uVar30;
            paVar23 = (aiNode *)paVar16->mLights[uVar36];
            if (paVar23 != paVar24) {
              (paVar23->mName).length = uVar30;
              memcpy((paVar23->mName).data,pcVar1,(ulong)uVar30);
              (paVar23->mName).data[uVar30] = '\0';
            }
            uVar36 = uVar36 + 1;
            lVar34 = lVar34 + 8;
          } while (uVar36 < local_238->mNumLights);
          ppaVar25 = (aiNode **)((long)ppaVar25 + lVar34);
          pScene = local_238;
        }
        if (pScene->mNumCameras != 0) {
          uVar36 = 0;
          do {
            paVar24 = (aiNode *)operator_new(0x478);
            aiNode::aiNode(paVar24);
            ppaVar25[uVar36] = paVar24;
            paVar24->mParent = pScene->mRootNode;
            pcVar1 = (paVar24->mName).data;
            uVar30 = snprintf(pcVar1,0x400,"cam_%u",uVar36 & 0xffffffff);
            (paVar24->mName).length = uVar30;
            paVar23 = (aiNode *)pScene->mCameras[uVar36];
            if (paVar23 != paVar24) {
              (paVar23->mName).length = uVar30;
              memcpy((paVar23->mName).data,pcVar1,(ulong)uVar30);
              (paVar23->mName).data[uVar30] = '\0';
            }
            uVar36 = uVar36 + 1;
            pScene = local_238;
          } while (uVar36 < local_238->mNumCameras);
        }
      }
    }
    else {
      MakeIdentityTransform(local_228,pScene->mRootNode);
    }
    if (local_228->configNormalize == true) {
      if ((ulong)pScene->mNumMeshes == 0) {
        fVar38 = 1e+10;
        fVar42 = 1e+10;
        fVar43 = 1e+10;
        fVar37 = -1e+10;
        fVar39 = -1e+10;
        fVar41 = -1e+10;
      }
      else {
        fVar39 = -1e+10;
        fVar41 = -1e+10;
        fVar37 = -1e+10;
        fVar42 = 1e+10;
        fVar43 = 1e+10;
        fVar38 = 1e+10;
        uVar36 = 0;
        do {
          uVar33 = (ulong)pScene->mMeshes[uVar36]->mNumVertices;
          if (uVar33 != 0) {
            paVar22 = pScene->mMeshes[uVar36]->mVertices;
            lVar34 = 0;
            do {
              fVar40 = *(float *)((long)&paVar22->x + lVar34);
              fVar3 = *(float *)((long)&paVar22->y + lVar34);
              if (fVar40 <= fVar42) {
                fVar42 = fVar40;
              }
              if (fVar3 <= fVar43) {
                fVar43 = fVar3;
              }
              fVar4 = *(float *)((long)&paVar22->z + lVar34);
              if (fVar4 <= fVar38) {
                fVar38 = fVar4;
              }
              if (fVar39 <= fVar40) {
                fVar39 = fVar40;
              }
              if (fVar41 <= fVar3) {
                fVar41 = fVar3;
              }
              if (fVar37 <= fVar4) {
                fVar37 = fVar4;
              }
              lVar34 = lVar34 + 0xc;
            } while (uVar33 * 0xc != lVar34);
          }
          uVar36 = uVar36 + 1;
        } while (uVar36 != pScene->mNumMeshes);
      }
      if (pScene->mNumMeshes != 0) {
        fVar37 = fVar37 - fVar38;
        fVar39 = fVar39 - fVar42;
        fVar41 = fVar41 - fVar43;
        fVar40 = fVar37;
        if (fVar37 <= fVar41) {
          fVar40 = fVar41;
        }
        if (fVar40 <= fVar39) {
          fVar40 = fVar39;
        }
        fVar40 = 1.0 / (fVar40 * 0.5);
        uVar36 = 0;
        do {
          paVar7 = pScene->mMeshes[uVar36];
          if (paVar7->mNumVertices != 0) {
            lVar34 = 8;
            uVar33 = 0;
            do {
              paVar22 = paVar7->mVertices;
              fVar3 = *(float *)((long)&paVar22->x + lVar34);
              *(ulong *)((long)paVar22 + lVar34 + -8) =
                   CONCAT44((*(float *)((long)paVar22 + lVar34 + -4) - (fVar41 * 0.5 + fVar43)) *
                            fVar40,(*(float *)((long)paVar22 + lVar34 + -8) -
                                   (fVar39 * 0.5 + fVar42)) * fVar40);
              *(float *)((long)&paVar22->x + lVar34) = (fVar3 - (fVar37 * 0.5 + fVar38)) * fVar40;
              uVar33 = uVar33 + 1;
              lVar34 = lVar34 + 0xc;
            } while (uVar33 < paVar7->mNumVertices);
          }
          uVar36 = uVar36 + 1;
        } while (uVar36 < pScene->mNumMeshes);
      }
    }
    bVar17 = DefaultLogger::isNullLogger();
    if (!bVar17) {
      pLVar18 = DefaultLogger::get();
      Logger::debug(pLVar18,"PretransformVerticesProcess finished");
      pLVar18 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[9]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)aiTemp,
                 (char (*) [9])0x1f0651);
      std::ostream::_M_insert<unsigned_long>((ulong)aiTemp);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)aiTemp," nodes and ",0xb);
      std::ostream::_M_insert<unsigned_long>((ulong)aiTemp);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)aiTemp," animation channels (",0x15);
      CountNodes(local_228,pScene->mRootNode);
      std::ostream::_M_insert<unsigned_long>((ulong)aiTemp);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)aiTemp," output nodes)",0xe);
      std::__cxx11::stringbuf::str();
      Logger::info(pLVar18,(char *)aiVFormats.
                                   super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl._M_node.super__List_node_base._M_next);
      psVar2 = &aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                _M_node._M_size;
      if (aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
          super__List_node_base._M_next != (_List_node_base *)psVar2) {
        operator_delete(aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl._M_node.super__List_node_base._M_next);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)aiTemp);
      std::ios_base::~ios_base(local_138);
      pLVar18 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[6]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)aiTemp,
                 (char (*) [6])"Kept ");
      std::ostream::_M_insert<unsigned_long>((ulong)aiTemp);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)aiTemp," lights and ",0xc);
      std::ostream::_M_insert<unsigned_long>((ulong)aiTemp);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)aiTemp," cameras.",9);
      std::__cxx11::stringbuf::str();
      Logger::info(pLVar18,(char *)aiVFormats.
                                   super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl._M_node.super__List_node_base._M_next);
      if (aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
          super__List_node_base._M_next != (_List_node_base *)psVar2) {
        operator_delete(aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl._M_node.super__List_node_base._M_next);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)aiTemp);
      std::ios_base::~ios_base(local_138);
      pLVar18 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[7]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)aiTemp,
                 (char (*) [7])"Moved ");
      std::ostream::_M_insert<unsigned_long>((ulong)aiTemp);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)aiTemp," meshes to WCS (number of output meshes: ",0x29);
      std::ostream::_M_insert<unsigned_long>((ulong)aiTemp);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)aiTemp,")",1);
      std::__cxx11::stringbuf::str();
      Logger::info(pLVar18,(char *)aiVFormats.
                                   super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl._M_node.super__List_node_base._M_next);
      if (aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
          super__List_node_base._M_next != (_List_node_base *)psVar2) {
        operator_delete(aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl._M_node.super__List_node_base._M_next);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)aiTemp);
      std::ios_base::~ios_base(local_138);
    }
    if (apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void PretransformVertices::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("PretransformVerticesProcess begin");

    // Return immediately if we have no meshes
    if (!pScene->mNumMeshes)
        return;

    const unsigned int iOldMeshes = pScene->mNumMeshes;
    const unsigned int iOldAnimationChannels = pScene->mNumAnimations;
    const unsigned int iOldNodes = CountNodes(pScene->mRootNode);

    if(configTransform) {
        pScene->mRootNode->mTransformation = configTransformation;
    }

    // first compute absolute transformation matrices for all nodes
    ComputeAbsoluteTransform(pScene->mRootNode);

    // Delete aiMesh::mBones for all meshes. The bones are
    // removed during this step and we need the pointer as
    // temporary storage
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i)    {
        aiMesh* mesh = pScene->mMeshes[i];

        for (unsigned int a = 0; a < mesh->mNumBones;++a)
            delete mesh->mBones[a];

        delete[] mesh->mBones;
        mesh->mBones = NULL;
    }

    // now build a list of output meshes
    std::vector<aiMesh*> apcOutMeshes;

    // Keep scene hierarchy? It's an easy job in this case ...
    // we go on and transform all meshes, if one is referenced by nodes
    // with different absolute transformations a depth copy of the mesh
    // is required.
    if( configKeepHierarchy ) {

        // Hack: store the matrix we're transforming a mesh with in aiMesh::mBones
        BuildWCSMeshes(apcOutMeshes,pScene->mMeshes,pScene->mNumMeshes, pScene->mRootNode);

        // ... if new meshes have been generated, append them to the end of the scene
        if (apcOutMeshes.size() > 0) {
            aiMesh** npp = new aiMesh*[pScene->mNumMeshes + apcOutMeshes.size()];

            memcpy(npp,pScene->mMeshes,sizeof(aiMesh*)*pScene->mNumMeshes);
            memcpy(npp+pScene->mNumMeshes,&apcOutMeshes[0],sizeof(aiMesh*)*apcOutMeshes.size());

            pScene->mNumMeshes  += static_cast<unsigned int>(apcOutMeshes.size());
            delete[] pScene->mMeshes; pScene->mMeshes = npp;
        }

        // now iterate through all meshes and transform them to worldspace
        for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
            ApplyTransform(pScene->mMeshes[i],*reinterpret_cast<aiMatrix4x4*>( pScene->mMeshes[i]->mBones ));

            // prevent improper destruction
            pScene->mMeshes[i]->mBones    = NULL;
            pScene->mMeshes[i]->mNumBones = 0;
        }
    } else {
        apcOutMeshes.reserve(pScene->mNumMaterials<<1u);
        std::list<unsigned int> aiVFormats;

        std::vector<unsigned int> s(pScene->mNumMeshes,0);
        BuildMeshRefCountArray(pScene->mRootNode,&s[0]);

        for (unsigned int i = 0; i < pScene->mNumMaterials;++i)     {
            // get the list of all vertex formats for this material
            aiVFormats.clear();
            GetVFormatList(pScene,i,aiVFormats);
            aiVFormats.sort();
            aiVFormats.unique();
            for (std::list<unsigned int>::const_iterator j =  aiVFormats.begin();j != aiVFormats.end();++j) {
                unsigned int iVertices = 0;
                unsigned int iFaces = 0;
                CountVerticesAndFaces(pScene,pScene->mRootNode,i,*j,&iFaces,&iVertices);
                if (0 != iFaces && 0 != iVertices)
                {
                    apcOutMeshes.push_back(new aiMesh());
                    aiMesh* pcMesh = apcOutMeshes.back();
                    pcMesh->mNumFaces = iFaces;
                    pcMesh->mNumVertices = iVertices;
                    pcMesh->mFaces = new aiFace[iFaces];
                    pcMesh->mVertices = new aiVector3D[iVertices];
                    pcMesh->mMaterialIndex = i;
                    if ((*j) & 0x2)pcMesh->mNormals = new aiVector3D[iVertices];
                    if ((*j) & 0x4)
                    {
                        pcMesh->mTangents    = new aiVector3D[iVertices];
                        pcMesh->mBitangents  = new aiVector3D[iVertices];
                    }
                    iFaces = 0;
                    while ((*j) & (0x100 << iFaces))
                    {
                        pcMesh->mTextureCoords[iFaces] = new aiVector3D[iVertices];
                        if ((*j) & (0x10000 << iFaces))pcMesh->mNumUVComponents[iFaces] = 3;
                        else pcMesh->mNumUVComponents[iFaces] = 2;
                        iFaces++;
                    }
                    iFaces = 0;
                    while ((*j) & (0x1000000 << iFaces))
                        pcMesh->mColors[iFaces++] = new aiColor4D[iVertices];

                    // fill the mesh ...
                    unsigned int aiTemp[2] = {0,0};
                    CollectData(pScene,pScene->mRootNode,i,*j,pcMesh,aiTemp,&s[0]);
                }
            }
        }

        // If no meshes are referenced in the node graph it is possible that we get no output meshes.
        if (apcOutMeshes.empty()) {
            
            throw DeadlyImportError("No output meshes: all meshes are orphaned and are not referenced by any nodes");
        }
        else
        {
            // now delete all meshes in the scene and build a new mesh list
            for (unsigned int i = 0; i < pScene->mNumMeshes;++i)
            {
                aiMesh* mesh = pScene->mMeshes[i];
                mesh->mNumBones = 0;
                mesh->mBones    = NULL;

                // we're reusing the face index arrays. avoid destruction
                for (unsigned int a = 0; a < mesh->mNumFaces; ++a) {
                    mesh->mFaces[a].mNumIndices = 0;
                    mesh->mFaces[a].mIndices = NULL;
                }

                delete mesh;

                // Invalidate the contents of the old mesh array. We will most
                // likely have less output meshes now, so the last entries of
                // the mesh array are not overridden. We set them to NULL to
                // make sure the developer gets notified when his application
                // attempts to access these fields ...
                mesh = NULL;
            }

            // It is impossible that we have more output meshes than
            // input meshes, so we can easily reuse the old mesh array
            pScene->mNumMeshes = (unsigned int)apcOutMeshes.size();
            for (unsigned int i = 0; i < pScene->mNumMeshes;++i) {
                pScene->mMeshes[i] = apcOutMeshes[i];
            }
        }
    }

    // remove all animations from the scene
    for (unsigned int i = 0; i < pScene->mNumAnimations;++i)
        delete pScene->mAnimations[i];
    delete[] pScene->mAnimations;

    pScene->mAnimations    = NULL;
    pScene->mNumAnimations = 0;

    // --- we need to keep all cameras and lights
    for (unsigned int i = 0; i < pScene->mNumCameras;++i)
    {
        aiCamera* cam = pScene->mCameras[i];
        const aiNode* nd = pScene->mRootNode->FindNode(cam->mName);
        ai_assert(NULL != nd);

        // multiply all properties of the camera with the absolute
        // transformation of the corresponding node
        cam->mPosition = nd->mTransformation * cam->mPosition;
        cam->mLookAt   = aiMatrix3x3( nd->mTransformation ) * cam->mLookAt;
        cam->mUp       = aiMatrix3x3( nd->mTransformation ) * cam->mUp;
    }

    for (unsigned int i = 0; i < pScene->mNumLights;++i)
    {
        aiLight* l = pScene->mLights[i];
        const aiNode* nd = pScene->mRootNode->FindNode(l->mName);
        ai_assert(NULL != nd);

        // multiply all properties of the camera with the absolute
        // transformation of the corresponding node
        l->mPosition   = nd->mTransformation * l->mPosition;
        l->mDirection  = aiMatrix3x3( nd->mTransformation ) * l->mDirection;
        l->mUp         = aiMatrix3x3( nd->mTransformation ) * l->mUp;
    }

    if( !configKeepHierarchy ) {

        // now delete all nodes in the scene and build a new
        // flat node graph with a root node and some level 1 children
        aiNode* newRoot = new aiNode();
        newRoot->mName = pScene->mRootNode->mName;
        delete pScene->mRootNode;
        pScene->mRootNode = newRoot;

        if (1 == pScene->mNumMeshes && !pScene->mNumLights && !pScene->mNumCameras)
        {
            pScene->mRootNode->mNumMeshes = 1;
            pScene->mRootNode->mMeshes = new unsigned int[1];
            pScene->mRootNode->mMeshes[0] = 0;
        }
        else
        {
            pScene->mRootNode->mNumChildren = pScene->mNumMeshes+pScene->mNumLights+pScene->mNumCameras;
            aiNode** nodes = pScene->mRootNode->mChildren = new aiNode*[pScene->mRootNode->mNumChildren];

            // generate mesh nodes
            for (unsigned int i = 0; i < pScene->mNumMeshes;++i,++nodes)
            {
                aiNode* pcNode = new aiNode();
                *nodes = pcNode;
                pcNode->mParent = pScene->mRootNode;
                pcNode->mName = pScene->mMeshes[i]->mName;

                // setup mesh indices
                pcNode->mNumMeshes = 1;
                pcNode->mMeshes = new unsigned int[1];
                pcNode->mMeshes[0] = i;
            }
            // generate light nodes
            for (unsigned int i = 0; i < pScene->mNumLights;++i,++nodes)
            {
                aiNode* pcNode = new aiNode();
                *nodes = pcNode;
                pcNode->mParent = pScene->mRootNode;
                pcNode->mName.length = ai_snprintf(pcNode->mName.data, MAXLEN, "light_%u",i);
                pScene->mLights[i]->mName = pcNode->mName;
            }
            // generate camera nodes
            for (unsigned int i = 0; i < pScene->mNumCameras;++i,++nodes)
            {
                aiNode* pcNode = new aiNode();
                *nodes = pcNode;
                pcNode->mParent = pScene->mRootNode;
                pcNode->mName.length = ::ai_snprintf(pcNode->mName.data,MAXLEN,"cam_%u",i);
                pScene->mCameras[i]->mName = pcNode->mName;
            }
        }
    }
    else {
        // ... and finally set the transformation matrix of all nodes to identity
        MakeIdentityTransform(pScene->mRootNode);
    }

    if (configNormalize) {
        // compute the boundary of all meshes
        aiVector3D min,max;
        MinMaxChooser<aiVector3D> ()(min,max);

        for (unsigned int a = 0; a <  pScene->mNumMeshes; ++a) {
            aiMesh* m = pScene->mMeshes[a];
            for (unsigned int i = 0; i < m->mNumVertices;++i) {
                min = std::min(m->mVertices[i],min);
                max = std::max(m->mVertices[i],max);
            }
        }

        // find the dominant axis
        aiVector3D d = max-min;
        const ai_real div = std::max(d.x,std::max(d.y,d.z))*ai_real( 0.5);

        d = min + d * (ai_real)0.5;
        for (unsigned int a = 0; a <  pScene->mNumMeshes; ++a) {
            aiMesh* m = pScene->mMeshes[a];
            for (unsigned int i = 0; i < m->mNumVertices;++i) {
                m->mVertices[i] = (m->mVertices[i]-d)/div;
            }
        }
    }

    // print statistics
    if (!DefaultLogger::isNullLogger()) {
        ASSIMP_LOG_DEBUG("PretransformVerticesProcess finished");

        ASSIMP_LOG_INFO_F("Removed ", iOldNodes, " nodes and ", iOldAnimationChannels, " animation channels (", 
            CountNodes(pScene->mRootNode) ," output nodes)" );
        ASSIMP_LOG_INFO_F("Kept ", pScene->mNumLights, " lights and ", pScene->mNumCameras, " cameras." );
        ASSIMP_LOG_INFO_F("Moved ", iOldMeshes, " meshes to WCS (number of output meshes: ", pScene->mNumMeshes, ")");
    }
}